

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O0

void Curl_cookie_clearall(CookieInfo *cookies)

{
  uint local_14;
  uint i;
  CookieInfo *cookies_local;
  
  if (cookies != (CookieInfo *)0x0) {
    for (local_14 = 0; local_14 < 0x3f; local_14 = local_14 + 1) {
      Curl_cookie_freelist(cookies->cookies[local_14]);
      cookies->cookies[local_14] = (Cookie *)0x0;
    }
    cookies->numcookies = 0;
  }
  return;
}

Assistant:

void Curl_cookie_clearall(struct CookieInfo *cookies)
{
  if(cookies) {
    unsigned int i;
    for(i = 0; i < COOKIE_HASH_SIZE; i++) {
      Curl_cookie_freelist(cookies->cookies[i]);
      cookies->cookies[i] = NULL;
    }
    cookies->numcookies = 0;
  }
}